

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::DeleteExpr(SQCompiler *this)

{
  SQInteger SVar1;
  bool bVar2;
  undefined7 uVar3;
  SQCompiler *in_RDI;
  SQInteger unaff_retaddr;
  SQExpState es;
  SQCompiler *in_stack_000000a0;
  SQCompiler *in_stack_ffffffffffffffe0;
  SQInteger SVar4;
  
  Lex(in_stack_ffffffffffffffe0);
  SVar4 = (in_RDI->_es).etype;
  SVar1 = (in_RDI->_es).epos;
  bVar2 = (in_RDI->_es).donot_get;
  uVar3 = *(undefined7 *)&(in_RDI->_es).field_0x11;
  (in_RDI->_es).donot_get = true;
  PrefixedExpr(in_stack_000000a0);
  if ((in_RDI->_es).etype == 1) {
    Error(in_RDI,"can\'t delete an expression");
  }
  if (((in_RDI->_es).etype == 2) || ((in_RDI->_es).etype == 3)) {
    Emit2ArgsOP((SQCompiler *)es.epos,es.etype._4_4_,unaff_retaddr);
  }
  else {
    Error(in_RDI,"cannot delete an (outer) local");
  }
  (in_RDI->_es).etype = SVar4;
  (in_RDI->_es).epos = SVar1;
  (in_RDI->_es).donot_get = bVar2;
  *(undefined7 *)&(in_RDI->_es).field_0x11 = uVar3;
  return;
}

Assistant:

void DeleteExpr()
    {
        SQExpState es;
        Lex();
        es = _es;
        _es.donot_get = true;
        PrefixedExpr();
        if(_es.etype==EXPR) Error(_SC("can't delete an expression"));
        if(_es.etype==OBJECT || _es.etype==BASE) {
            Emit2ArgsOP(_OP_DELETE);
        }
        else {
            Error(_SC("cannot delete an (outer) local"));
        }
        _es = es;
    }